

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O0

void nn_backtrace_print(void)

{
  int iVar1;
  int iVar2;
  undefined1 local_198 [4];
  int size;
  void *frames [50];
  
  iVar1 = backtrace(local_198,0x32);
  if (1 < iVar1) {
    iVar2 = fileno(_stderr);
    backtrace_symbols_fd(frames,iVar1 + -1,iVar2);
  }
  return;
}

Assistant:

void nn_backtrace_print (void)
{
    void *frames[50];
    int size;
    size = backtrace (frames, sizeof (frames) / sizeof (frames[0]));
    if (size > 1) {
        /*  Don't include the frame nn_backtrace_print itself. */
        backtrace_symbols_fd (&frames[1], size-1, fileno (stderr));
    }
}